

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

void Gia_ManFalseRebuildOne
               (Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vHook,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  uint uVar9;
  
  if (vHook->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = *vHook->pArray;
  if ((-1 < (long)iVar2) && (iVar2 < p->nObjs)) {
    pGVar7 = p->pObjs + iVar2;
    if (vHook->nSize == 1) {
      pGVar7->Value = 0;
    }
    else {
      uVar6 = vHook->pArray[1];
      if (((long)(int)uVar6 < 0) || ((uint)p->nObjs <= uVar6)) goto LAB_00741abc;
      pGVar1 = p->pObjs + (int)uVar6;
      uVar6 = (uint)*(undefined8 *)pGVar1;
      if ((pGVar1 + -(ulong)(uVar6 & 0x1fffffff) != pGVar7) &&
         (uVar6 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20),
         pGVar1 + -(ulong)(uVar6 & 0x1fffffff) != pGVar7)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFalse.c"
                      ,0x41,
                      "void Gia_ManFalseRebuildOne(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int)"
                     );
      }
      lVar8 = 0;
      pGVar7 = (Gia_Obj_t *)0x0;
      uVar9 = 0xffffffff;
      do {
        iVar2 = vHook->pArray[lVar8];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00741abc;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + iVar2;
        uVar3 = pGVar1->Value;
        uVar5 = uVar6 >> 0x1d & 1;
        if (lVar8 != 0) {
          uVar4 = *(ulong *)pGVar1;
          if ((int)pGVar1[-(ulong)((uint)uVar4 & 0x1fffffff)].Value < 0) {
LAB_00741adb:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = (uint)(uVar4 >> 0x20);
          if ((int)pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_00741adb;
          uVar5 = Gia_ManHashAnd(pNew,(uint)(uVar4 >> 0x1d) & 1 ^
                                      pGVar1[-(ulong)((uint)uVar4 & 0x1fffffff)].Value,
                                 pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
        }
        pGVar1->Value = uVar5;
        if (pGVar7 != (Gia_Obj_t *)0x0) {
          pGVar7->Value = uVar9;
        }
        lVar8 = lVar8 + 1;
        pGVar7 = pGVar1;
        uVar9 = uVar3;
      } while (lVar8 < vHook->nSize);
      if (fVeryVerbose != 0) {
        printf("Eliminated path: ");
        printf("Vector has %d entries: {",(ulong)(uint)vHook->nSize);
        if (0 < vHook->nSize) {
          lVar8 = 0;
          do {
            printf(" %d",(ulong)(uint)vHook->pArray[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 < vHook->nSize);
        }
        puts(" }");
        if (0 < vHook->nSize) {
          lVar8 = 0;
          do {
            iVar2 = vHook->pArray[lVar8];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00741abc;
            pGVar7 = p->pObjs;
            if (pGVar7 == (Gia_Obj_t *)0x0) {
              return;
            }
            uVar6 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar2);
            printf("Level %3d : ",(ulong)uVar6);
            Gia_ObjPrint(p,pGVar7 + iVar2);
            lVar8 = lVar8 + 1;
          } while (lVar8 < vHook->nSize);
        }
      }
    }
    return;
  }
LAB_00741abc:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reconstruct the AIG after detecting false paths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManFalseRebuildOne( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vHook, int fVerbose, int fVeryVerbose )
{
    Gia_Obj_t * pObj, * pObj1, * pPrev = NULL;
    int i, CtrlValue = 0, iPrevValue = -1;
    pObj = Gia_ManObj( p, Vec_IntEntry(vHook, 0) );
    if ( Vec_IntSize(vHook) == 1 )
    {
        pObj->Value = 0; // what if stuck at 1???
        return;
    }
    assert( Vec_IntSize(vHook) >= 2 );
    // find controlling value
    pObj1 = Gia_ManObj( p, Vec_IntEntry(vHook, 1) );
    if ( Gia_ObjFanin0(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC0(pObj1);
    else if ( Gia_ObjFanin1(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC1(pObj1);
    else assert( 0 );
//    printf( "%d ", CtrlValue );
    // rewrite the path
    Gia_ManForEachObjVec( vHook, p, pObj, i )
    {
        int iObjValue = pObj->Value;
        pObj->Value = i ? Gia_ManHashAnd(pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj)) : CtrlValue;
        if ( pPrev )
            pPrev->Value = iPrevValue;
        iPrevValue = iObjValue;
        pPrev = pObj;
    }
    if ( fVeryVerbose )
    {
        printf( "Eliminated path: " );
        Vec_IntPrint( vHook );
        Gia_ManForEachObjVec( vHook, p, pObj, i )
        {
            printf( "Level %3d : ", Gia_ObjLevel(p, pObj) );
            Gia_ObjPrint( p, pObj );
        }
    }
}